

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O2

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  SVNInfo *svninfo;
  string *this_00;
  string *p1;
  SVNInfo *pSVar1;
  cmCTest *this_01;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  string *this_02;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  bVar2 = LoadRepositories(this);
  if (bVar2) {
    pSVar1 = (this->Repositories).
             super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_02 = (string *)
              &((this->Repositories).
                super__Vector_base<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>.
                _M_impl.super__Vector_impl_data._M_start)->Base;
    while( true ) {
      svninfo = (SVNInfo *)(this_02 + -0x60);
      if (svninfo == pSVar1) break;
      LoadInfo_abi_cxx11_((string *)&cmCTestLog_msg,this,svninfo);
      this_00 = this_02 + 0x40;
      std::__cxx11::string::operator=(this_00,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar4 = std::operator<<(poVar4,(string *)svninfo);
      poVar4 = std::operator<<(poVar4,"\' after update: ");
      poVar4 = std::operator<<(poVar4,this_00);
      std::operator<<(poVar4,"\n");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                               "   New revision of external repository \'");
      poVar4 = std::operator<<(poVar4,(string *)svninfo);
      poVar4 = std::operator<<(poVar4,"\' is: ");
      poVar4 = std::operator<<(poVar4,this_00);
      std::operator<<(poVar4,"\n");
      this_01 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_01,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x8b,local_1c8._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar4 = std::operator<<(poVar4,(string *)svninfo);
      poVar4 = std::operator<<(poVar4,"\' URL = ");
      p1 = (string *)(this_02 + -0x40);
      poVar4 = std::operator<<(poVar4,(string *)p1);
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar4 = std::operator<<(poVar4,(string *)svninfo);
      poVar4 = std::operator<<(poVar4,"\' Root = ");
      poVar4 = std::operator<<(poVar4,this_02 + -0x20);
      std::operator<<(poVar4,"\n");
      if (*(long *)(this_02 + -0x18) != 0) {
        bVar3 = cmCTestSVNPathStarts(p1,(string *)(this_02 + -0x20));
        if (bVar3) {
          std::__cxx11::string::substr((ulong)&local_1c8,(ulong)p1);
          cmCTest::DecodeURL((string *)&cmCTestLog_msg,&local_1c8);
          std::__cxx11::string::operator=(this_02,(string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          std::__cxx11::string::~string((string *)&local_1c8);
          std::__cxx11::string::append((char *)this_02);
        }
      }
      poVar4 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar4 = std::operator<<(poVar4,(string *)svninfo);
      poVar4 = std::operator<<(poVar4,"\' Base = ");
      poVar4 = std::operator<<(poVar4,this_02);
      std::operator<<(poVar4,"\n");
      this_02 = this_02 + 0xc0;
    }
    std::__cxx11::string::_M_assign((string *)&(this->super_cmCTestGlobalVC).NewRevision);
  }
  return bVar2;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  std::vector<SVNInfo>::iterator itbeg = this->Repositories.begin();
  std::vector<SVNInfo>::iterator itend = this->Repositories.end();
  for (; itbeg != itend; itbeg++) {
    SVNInfo& svninfo = *itbeg;
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(
      this->CTest, HANDLER_OUTPUT, "   New revision of external repository '"
        << svninfo.LocalPath << "' is: " << svninfo.NewRevision << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base =
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size()));
      svninfo.Base += "/";
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}